

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::Imputer::ByteSizeLong(Imputer *this)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  
  switch(this->_oneof_case_[0]) {
  case 1:
    sVar5 = 9;
    goto LAB_001a5fc8;
  case 2:
    uVar3 = (this->ImputedValue_).imputedint64value_ | 1;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = (size_t)((int)lVar2 * 9 + 0x89U >> 6);
    goto LAB_001a5fc8;
  case 3:
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)((this->ImputedValue_).imputedint64value_ & 0xfffffffffffffffe));
    break;
  case 4:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::DoubleVector>
                      ((this->ImputedValue_).imputeddoublearray_);
    break;
  case 5:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64Vector>
                      ((this->ImputedValue_).imputedint64array_);
    break;
  case 6:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::StringToDoubleMap>
                      ((this->ImputedValue_).imputedstringdictionary_);
    break;
  case 7:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::Int64ToDoubleMap>
                      ((this->ImputedValue_).imputedint64dictionary_);
    break;
  default:
    sVar5 = 0;
    goto LAB_001a5fc8;
  }
  sVar5 = sVar5 + 1;
LAB_001a5fc8:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0xd) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)((this->ReplaceValue_).replaceint64value_ & 0xfffffffffffffffe));
    sVar5 = sVar5 + sVar4 + 1;
  }
  else if (uVar1 == 0xc) {
    uVar3 = (this->ReplaceValue_).replaceint64value_ | 1;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
  }
  else if (uVar1 == 0xb) {
    sVar5 = sVar5 + 9;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t Imputer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Imputer)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (ImputedValue_case()) {
    // double imputedDoubleValue = 1;
    case kImputedDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 imputedInt64Value = 2;
    case kImputedInt64Value: {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_imputedint64value());
      break;
    }
    // string imputedStringValue = 3;
    case kImputedStringValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_imputedstringvalue());
      break;
    }
    // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
    case kImputedDoubleArray: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputeddoublearray_);
      break;
    }
    // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
    case kImputedInt64Array: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedint64array_);
      break;
    }
    // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
    case kImputedStringDictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedstringdictionary_);
      break;
    }
    // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
    case kImputedInt64Dictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ImputedValue_.imputedint64dictionary_);
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (ReplaceValue_case()) {
    // double replaceDoubleValue = 11;
    case kReplaceDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 replaceInt64Value = 12;
    case kReplaceInt64Value: {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_replaceint64value());
      break;
    }
    // string replaceStringValue = 13;
    case kReplaceStringValue: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}